

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O1

int __thiscall ON_String::Remove(ON_String *this,char utf8_single_byte_c)

{
  int *piVar1;
  int iVar2;
  char *pcVar3;
  ON_Internal_Empty_aString *pOVar4;
  char *pcVar5;
  char *pcVar6;
  
  iVar2 = ON_IsValidSingleByteUTF8CharValue(utf8_single_byte_c);
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    CopyArray(this);
    pcVar3 = this->m_s;
    pOVar4 = (ON_Internal_Empty_aString *)(pcVar3 + -0xc);
    if (pcVar3 == (char *)0x0) {
      pOVar4 = &empty_astring;
    }
    iVar2 = (pOVar4->header).string_length;
    pcVar5 = pcVar3;
    if (0 < iVar2 && pcVar3 != (char *)0x0) {
      pcVar6 = pcVar3 + iVar2;
      do {
        if (*pcVar3 != utf8_single_byte_c) {
          *pcVar5 = *pcVar3;
          pcVar5 = pcVar5 + 1;
        }
        pcVar3 = pcVar3 + 1;
      } while (pcVar3 < pcVar6);
    }
    *pcVar5 = '\0';
    iVar2 = (int)pcVar3 - (int)pcVar5;
    pOVar4 = (ON_Internal_Empty_aString *)(this->m_s + -0xc);
    if (this->m_s == (char *)0x0) {
      pOVar4 = &empty_astring;
    }
    piVar1 = &(pOVar4->header).string_length;
    *piVar1 = *piVar1 - iVar2;
  }
  return iVar2;
}

Assistant:

int ON_String::Remove(const char utf8_single_byte_c)
{
  if (false == ON_IsValidSingleByteUTF8CharValue(utf8_single_byte_c))
    return 0;

  CopyArray();

  char* pstrSource = m_s;
  char* pstrDest = m_s;
  char* pstrEnd = m_s + Length();

  while( pstrSource && pstrSource  < pstrEnd)
  {
    if (*pstrSource != utf8_single_byte_c)
    {
      *pstrDest = *pstrSource;
      pstrDest++;
    }
    pstrSource++;
  }

  *pstrDest = 0;
  int nCount = (int)(pstrSource - pstrDest); // the (int) is for 64 bit size_t conversion

  Header()->string_length -= nCount;

  return nCount;
}